

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O0

int error(int argc,char **argv)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  Allocator alloc;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<int> out;
  FILE *__stream;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  reference pvVar6;
  iterator metadata;
  size_type sVar7;
  reference pvVar8;
  undefined8 uVar9;
  uint *puVar10;
  undefined8 uVar11;
  vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
  *pvVar12;
  reference this;
  long *in_RSI;
  double dVar13;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar14 [16];
  undefined1 auVar16 [12];
  undefined1 extraout_var [56];
  undefined1 auVar15 [64];
  double error;
  int c_1;
  Float varSum;
  int x_1;
  int y_1;
  Image errorImage;
  int c;
  int x;
  int y;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  *pixVar;
  iterator __end1_2;
  iterator __begin1_2;
  vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
  *__range1_2;
  value_type *mcve_1;
  iterator __end1_1;
  iterator __begin1_1;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  *__range1_1;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  pixelVariance;
  double sumError;
  int i;
  atomic<bool> failed;
  vector<int,_std::allocator<int>_> spp;
  vector<double,_std::allocator<double>_> sumErrors;
  value_type *mcve;
  iterator __end2;
  iterator __begin2;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  *__range2;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  *amcve;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
  *__range1;
  vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
  pixelVariances;
  anon_class_8_1_e625a05e crop;
  Image *referenceImage;
  ImageAndMetadata ref;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  anon_class_1_0_00000001 onError;
  array<int,_4UL> cropWindow;
  string filenameBase;
  string metric;
  string errorFile;
  string referenceFile;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff308;
  ImageAndMetadata *in_stack_fffffffffffff310;
  int in_stack_fffffffffffff318;
  int in_stack_fffffffffffff31c;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff320;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  *in_stack_fffffffffffff328;
  int in_stack_fffffffffffff330;
  int in_stack_fffffffffffff334;
  undefined7 in_stack_fffffffffffff338;
  undefined1 in_stack_fffffffffffff33f;
  allocator_type in_stack_fffffffffffff340;
  undefined1 in_stack_fffffffffffff348 [64];
  Image *in_stack_fffffffffffff388;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff390;
  byte local_c19;
  ColorEncodingHandle *in_stack_fffffffffffff420;
  undefined8 in_stack_fffffffffffff428;
  PixelFormat format;
  undefined4 in_stack_fffffffffffff430;
  undefined4 in_stack_fffffffffffff434;
  undefined4 in_stack_fffffffffffff438;
  undefined4 in_stack_fffffffffffff43c;
  undefined8 in_stack_fffffffffffff440;
  undefined4 in_stack_fffffffffffff448;
  undefined4 in_stack_fffffffffffff44c;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffff450;
  string *local_b98;
  Image *in_stack_fffffffffffff488;
  anon_class_8_1_e625a05e *in_stack_fffffffffffff490;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffff4e0;
  undefined4 in_stack_fffffffffffff4e8;
  undefined4 in_stack_fffffffffffff4ec;
  string *in_stack_fffffffffffff4f0;
  char ***in_stack_fffffffffffff4f8;
  string *in_stack_fffffffffffff508;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffff528;
  undefined4 in_stack_fffffffffffff530;
  undefined4 in_stack_fffffffffffff534;
  char ***in_stack_fffffffffffff538;
  undefined4 in_stack_fffffffffffff540;
  undefined4 in_stack_fffffffffffff544;
  value_type vVar17;
  size_t in_stack_fffffffffffff548;
  bool local_9b9;
  optional<float> local_908;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_900;
  undefined4 local_8c0;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_8bc;
  undefined4 local_87c;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_878;
  undefined4 local_868;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_864;
  undefined4 local_85c;
  optional<int> local_858;
  optional<float> local_850;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  double local_808;
  int local_7f8;
  float local_7f4;
  Tuple2<pbrt::Point2,_int> local_7f0;
  int local_7e8;
  Tuple2<pbrt::Point2,_int> local_7e4;
  int local_7dc;
  undefined8 local_7d8;
  string *local_7c8;
  string local_7c0 [32];
  string *local_7a0;
  undefined8 local_798;
  Tuple2<pbrt::Point2,_int> local_780;
  Tuple2<pbrt::Point2,_int> local_778;
  int local_64c;
  Tuple2<pbrt::Point2,_int> local_648;
  int local_640;
  Tuple2<pbrt::Point2,_int> local_63c;
  int local_634;
  reference local_630;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  *local_628;
  __normal_iterator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_*,_std::vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>_>
  local_620;
  string *local_618;
  iterator local_610;
  iterator local_608;
  iterator local_600;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  *local_5f8;
  Tuple2<pbrt::Point2,_int> local_5e8;
  Tuple2<pbrt::Point2,_int> local_5e0;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  local_5d8;
  double *local_5b8;
  double *local_5b0;
  double local_5a8;
  int local_59c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_598;
  undefined1 *local_590;
  vector<int,_std::allocator<int>_> *local_588;
  Image *local_580;
  string *local_578;
  undefined1 *local_570;
  string *local_568;
  undefined1 local_53a;
  vector<int,_std::allocator<int>_> local_538;
  undefined8 local_518;
  undefined1 local_510 [24];
  iterator local_4f8;
  iterator local_4f0;
  iterator local_4e8;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  *local_4e0;
  Tuple2<pbrt::Point2,_int> local_4d0;
  Tuple2<pbrt::Point2,_int> local_4c8;
  reference local_4a0;
  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
  *local_498;
  string *name;
  Image *in_stack_fffffffffffffb80;
  string local_478;
  Image *local_458;
  Image local_440;
  ColorEncodingHandle *in_stack_fffffffffffffda8;
  string *in_stack_fffffffffffffdb0;
  Allocator in_stack_fffffffffffffdb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  byte local_201;
  span<int> local_1e0;
  byte local_1cb;
  byte local_1ca;
  allocator<char> local_1c9;
  string local_1c8 [39];
  byte local_1a1;
  byte local_17b;
  byte local_17a;
  allocator<char> local_179;
  string local_178 [39];
  byte local_151;
  byte local_12b;
  byte local_12a;
  allocator<char> local_129;
  string local_128 [71];
  allocator<char> local_e1;
  string local_e0 [40];
  undefined8 local_b8;
  undefined8 local_b0;
  string local_a8 [55];
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  long *local_10;
  uint local_4;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff348._8_8_,in_stack_fffffffffffff348._0_8_,
             (allocator<char> *)in_stack_fffffffffffff340.memoryResource);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::string(local_a8);
  local_b8 = 0xffffffff;
  local_b0 = 0xffffffff;
  while (*local_10 != 0) {
    std::allocator<char>::allocator();
    local_12a = 0;
    local_12b = 0;
    local_151 = 0;
    local_17a = 0;
    local_17b = 0;
    local_1a1 = 0;
    local_1ca = 0;
    local_1cb = 0;
    local_201 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff348._8_8_,in_stack_fffffffffffff348._0_8_,
               (allocator<char> *)in_stack_fffffffffffff340.memoryResource);
    std::function<void(std::__cxx11::string)>::function<error(int,char**)::__0&,void>
              ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)in_stack_fffffffffffff320._M_current,
               (anon_class_1_0_00000001 *)
               CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318));
    bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                      (in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                       in_stack_fffffffffffff4e0);
    local_9b9 = true;
    if (!bVar1) {
      std::allocator<char>::allocator();
      local_12a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff348._8_8_,in_stack_fffffffffffff348._0_8_,
                 (allocator<char> *)in_stack_fffffffffffff340.memoryResource);
      local_12b = 1;
      std::function<void(std::__cxx11::string)>::function<error(int,char**)::__0&,void>
                ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)in_stack_fffffffffffff320._M_current,
                 (anon_class_1_0_00000001 *)
                 CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318));
      local_151 = 1;
      bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                        (in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                         in_stack_fffffffffffff4e0);
      local_9b9 = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        local_17a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff348._8_8_,in_stack_fffffffffffff348._0_8_,
                   (allocator<char> *)in_stack_fffffffffffff340.memoryResource);
        local_17b = 1;
        std::function<void(std::__cxx11::string)>::function<error(int,char**)::__0&,void>
                  ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)in_stack_fffffffffffff320._M_current,
                   (anon_class_1_0_00000001 *)
                   CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318));
        local_1a1 = 1;
        bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                          (in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                           in_stack_fffffffffffff4e0);
        local_9b9 = true;
        if (!bVar1) {
          std::allocator<char>::allocator();
          local_1ca = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff348._8_8_,in_stack_fffffffffffff348._0_8_,
                     (allocator<char> *)in_stack_fffffffffffff340.memoryResource);
          local_1cb = 1;
          local_1e0 = pstd::MakeSpan<std::array<int,_4UL>_>
                                ((array<int,_4UL> *)in_stack_fffffffffffff310);
          std::function<void(std::__cxx11::string)>::function<error(int,char**)::__0&,void>
                    ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                      *)in_stack_fffffffffffff320._M_current,
                     (anon_class_1_0_00000001 *)
                     CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318));
          local_201 = 1;
          out.ptr._4_4_ = in_stack_fffffffffffff544;
          out.ptr._0_4_ = in_stack_fffffffffffff540;
          out.n = in_stack_fffffffffffff548;
          local_9b9 = pbrt::ParseArg<pstd::span<int>>
                                (in_stack_fffffffffffff538,
                                 (string *)
                                 CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),out,
                                 in_stack_fffffffffffff528);
        }
      }
    }
    if ((local_201 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3d5d62);
    }
    if ((local_1cb & 1) != 0) {
      std::__cxx11::string::~string(local_1c8);
    }
    if ((local_1ca & 1) != 0) {
      std::allocator<char>::~allocator(&local_1c9);
    }
    if ((local_1a1 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3d5dad);
    }
    if ((local_17b & 1) != 0) {
      std::__cxx11::string::~string(local_178);
    }
    if ((local_17a & 1) != 0) {
      std::allocator<char>::~allocator(&local_179);
    }
    if ((local_151 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3d5df8);
    }
    if ((local_12b & 1) != 0) {
      std::__cxx11::string::~string(local_128);
    }
    if ((local_12a & 1) != 0) {
      std::allocator<char>::~allocator(&local_129);
    }
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *)0x3d5e37);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator(&local_e1);
    if (local_9b9 == false) {
      uVar5 = std::__cxx11::string::empty();
      if (((uVar5 & 1) == 0) || (*(char *)*local_10 == '-')) {
        usage("error","%s: unknown argument",*local_10);
      }
      else {
        std::__cxx11::string::operator=(local_a8,(char *)*local_10);
        local_10 = local_10 + 1;
      }
    }
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    usage("error","Must provide base filename.");
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff310,(char *)in_stack_fffffffffffff308);
  if (((bVar1) &&
      (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff310,(char *)in_stack_fffffffffffff308), bVar1))
     && (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff310,(char *)in_stack_fffffffffffff308),
        bVar1)) {
    uVar9 = std::__cxx11::string::c_str();
    usage("error","%s: --metric must be \"L1\", \"MSE\" or \"MRSE\".",uVar9);
  }
  pbrt::MatchingFilenames(in_stack_fffffffffffff508);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff320._M_current);
  __stream = _stderr;
  if (bVar1) {
    uVar9 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s: no matching filenames!\n",uVar9);
    local_4 = 1;
  }
  else {
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      usage("error","must provide --reference file.");
    }
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff310);
    pbrt::ColorEncodingHandle::TaggedPointer
              ((ColorEncodingHandle *)in_stack_fffffffffffff310,in_stack_fffffffffffff308);
    pbrt::Image::Read(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffda8)
    ;
    local_458 = &local_440;
    pvVar6 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)in_stack_fffffffffffff310,
                        (size_type)in_stack_fffffffffffff308);
    if (*pvVar6 < 0) {
      pvVar6 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)in_stack_fffffffffffff310,
                          (size_type)in_stack_fffffffffffff308);
      iVar3 = *pvVar6;
      pvVar6 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)in_stack_fffffffffffff310,
                          (size_type)in_stack_fffffffffffff308);
      iVar2 = *pvVar6;
      pvVar6 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)in_stack_fffffffffffff310,
                          (size_type)in_stack_fffffffffffff308);
      *pvVar6 = iVar3 - iVar2;
    }
    pvVar6 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)in_stack_fffffffffffff310,
                        (size_type)in_stack_fffffffffffff308);
    if (*pvVar6 < 0) {
      pvVar6 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)in_stack_fffffffffffff310,
                          (size_type)in_stack_fffffffffffff308);
      iVar3 = *pvVar6;
      pvVar6 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)in_stack_fffffffffffff310,
                          (size_type)in_stack_fffffffffffff308);
      iVar2 = *pvVar6;
      pvVar6 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)in_stack_fffffffffffff310,
                          (size_type)in_stack_fffffffffffff308);
      *pvVar6 = iVar3 - iVar2;
    }
    local_478.field_2._8_8_ = &local_b8;
    ::error::anon_class_8_1_e625a05e::operator()
              (in_stack_fffffffffffff490,in_stack_fffffffffffff488);
    pbrt::MaxThreadIndex();
    std::
    allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>
    ::allocator((allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>
                 *)0x3d6426);
    std::
    vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
    ::vector((vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
             (size_type)in_stack_fffffffffffff328,
             (allocator_type *)in_stack_fffffffffffff320._M_current);
    std::
    allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>
    ::~allocator((allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>
                  *)0x3d6452);
    name = &local_478;
    metadata = std::
               vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
               ::begin((vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
                        *)in_stack_fffffffffffff308);
    local_498 = (Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                 *)std::
                   vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
                   ::end((vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
                          *)in_stack_fffffffffffff308);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_*,_std::vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>_>
                               *)in_stack_fffffffffffff310,
                              (__normal_iterator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_*,_std::vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>_>
                               *)in_stack_fffffffffffff308), bVar1) {
      local_4a0 = __gnu_cxx::
                  __normal_iterator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_*,_std::vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>_>
                  ::operator*((__normal_iterator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_*,_std::vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>_>
                               *)&stack0xfffffffffffffb70);
      local_4c8 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_458);
      local_4d0 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_458);
      pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff310);
      pbrt::
      Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
      ::Array2D((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffff33f,in_stack_fffffffffffff338),
                in_stack_fffffffffffff334,in_stack_fffffffffffff330,in_stack_fffffffffffff340);
      pbrt::
      Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
      ::operator=((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                  in_stack_fffffffffffff328);
      pbrt::
      Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
      ::~Array2D((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                  *)in_stack_fffffffffffff320._M_current);
      local_4e0 = local_4a0;
      local_4e8 = pbrt::
                  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                  ::begin(local_4a0);
      local_4f0 = pbrt::
                  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                  ::end((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                         *)in_stack_fffffffffffff310);
      for (; local_4e8 != local_4f0; local_4e8 = local_4e8 + 1) {
        local_4f8 = local_4e8;
        pbrt::Image::NChannels((Image *)0x3d6620);
        std::
        vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>::
        resize((vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
               (size_type)in_stack_fffffffffffff328);
      }
      __gnu_cxx::
      __normal_iterator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_*,_std::vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>_>
      ::operator++((__normal_iterator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_*,_std::vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>_>
                    *)&stack0xfffffffffffffb70);
    }
    pbrt::MaxThreadIndex();
    local_518 = 0;
    std::allocator<double>::allocator((allocator<double> *)0x3d672c);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
               (size_type)in_stack_fffffffffffff328,in_stack_fffffffffffff320._M_current,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318));
    std::allocator<double>::~allocator((allocator<double> *)0x3d6760);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size(&local_220);
    std::allocator<int>::allocator((allocator<int> *)0x3d678a);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
               (size_type)in_stack_fffffffffffff328,
               (allocator_type *)in_stack_fffffffffffff320._M_current);
    std::allocator<int>::~allocator((allocator<int> *)0x3d67b6);
    local_53a = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size(&local_220);
    local_590 = (undefined1 *)((long)&local_478.field_2 + 8);
    local_588 = &local_538;
    local_580 = local_458;
    local_578 = local_70;
    local_570 = local_510;
    local_568 = &local_478;
    local_598 = &local_220;
    std::function<void(long)>::function<error(int,char**)::__1,void>
              ((function<void_(long)> *)in_stack_fffffffffffff320._M_current,
               (anon_class_56_7_674f5bc2 *)
               CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318));
    pbrt::ParallelFor(in_stack_fffffffffffff348._24_8_,in_stack_fffffffffffff348._16_8_,
                      in_stack_fffffffffffff348._8_8_);
    std::function<void_(long)>::~function((function<void_(long)> *)0x3d688d);
    local_59c = 1;
    while( true ) {
      uVar5 = (ulong)local_59c;
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_220);
      if (sVar7 <= uVar5) break;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_538,(long)local_59c);
      vVar17 = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_538,0);
      if (vVar17 != *pvVar8) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_220,(long)local_59c);
        uVar9 = std::__cxx11::string::c_str();
        puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                    (&local_538,(long)local_59c);
        uVar4 = *puVar10;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_220,0);
        uVar11 = std::__cxx11::string::c_str();
        puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_538,0);
        printf("%s: spp %d mismatch. %s has %d.\n",uVar9,(ulong)uVar4,uVar11,(ulong)*puVar10);
        local_4 = 1;
        goto LAB_003d77d2;
      }
      local_59c = local_59c + 1;
    }
    bVar1 = std::atomic::operator_cast_to_bool
                      ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318)
                      );
    if (bVar1) {
      local_4 = 1;
    }
    else {
      local_5b0 = (double *)
                  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffff308);
      local_5b8 = (double *)
                  std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffff308);
      __last._M_current._4_4_ = in_stack_fffffffffffff31c;
      __last._M_current._0_4_ = in_stack_fffffffffffff318;
      local_5a8 = std::
                  accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                            (in_stack_fffffffffffff320,__last,(double)in_stack_fffffffffffff310);
      local_5e0 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_458);
      local_5e8 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_458);
      pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff310);
      pbrt::
      Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
      ::Array2D((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffff33f,in_stack_fffffffffffff338),
                in_stack_fffffffffffff334,in_stack_fffffffffffff330,in_stack_fffffffffffff340);
      local_5f8 = &local_5d8;
      local_600 = pbrt::
                  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                  ::begin(local_5f8);
      local_608 = pbrt::
                  Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                  ::end((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                         *)in_stack_fffffffffffff310);
      for (; local_600 != local_608; local_600 = local_600 + 1) {
        local_610 = local_600;
        pbrt::Image::NChannels((Image *)0x3d6c65);
        std::
        vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>::
        resize((vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
               (size_type)in_stack_fffffffffffff328);
      }
      local_618 = &local_478;
      local_620._M_current =
           (Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
            *)std::
              vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
              ::begin((vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
                       *)in_stack_fffffffffffff308);
      local_628 = (Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                   *)std::
                     vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
                     ::end((vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
                            *)in_stack_fffffffffffff308);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_*,_std::vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>_>
                            *)in_stack_fffffffffffff310,
                           (__normal_iterator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_*,_std::vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>_>
                            *)in_stack_fffffffffffff308);
        format = (PixelFormat)((ulong)in_stack_fffffffffffff428 >> 0x20);
        if (!bVar1) break;
        local_630 = __gnu_cxx::
                    __normal_iterator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_*,_std::vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>_>
                    ::operator*(&local_620);
        local_634 = 0;
        while( true ) {
          iVar3 = local_634;
          local_63c = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_458);
          if (local_63c.y <= iVar3) break;
          local_640 = 0;
          while( true ) {
            iVar3 = local_640;
            local_648 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_458);
            if (local_648.x <= iVar3) break;
            for (local_64c = 0; iVar3 = local_64c, iVar2 = pbrt::Image::NChannels((Image *)0x3d6df3)
                , iVar3 < iVar2; local_64c = local_64c + 1) {
              pvVar12 = pbrt::
                        Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                        ::operator()((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                                      *)in_stack_fffffffffffff320._M_current,
                                     in_stack_fffffffffffff31c,in_stack_fffffffffffff318);
              std::
              vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
              ::operator[](pvVar12,(long)local_64c);
              pvVar12 = pbrt::
                        Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                        ::operator()((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                                      *)in_stack_fffffffffffff320._M_current,
                                     in_stack_fffffffffffff31c,in_stack_fffffffffffff318);
              std::
              vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
              ::operator[](pvVar12,(long)local_64c);
              pbrt::VarianceEstimator<double>::Merge
                        ((VarianceEstimator<double> *)in_stack_fffffffffffff320._M_current,
                         (VarianceEstimator<double> *)
                         CONCAT44(in_stack_fffffffffffff31c,in_stack_fffffffffffff318));
            }
            local_640 = local_640 + 1;
          }
          local_634 = local_634 + 1;
        }
        __gnu_cxx::
        __normal_iterator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_*,_std::vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>_>
        ::operator++(&local_620);
      }
      local_778 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_458);
      local_780 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_458);
      pbrt::Point2<int>::Point2
                ((Point2<int> *)in_stack_fffffffffffff310,
                 (int)((ulong)in_stack_fffffffffffff308 >> 0x20),(int)in_stack_fffffffffffff308);
      local_7c8 = local_7c0;
      std::__cxx11::string::string(local_7c8,local_70);
      local_7a0 = local_7c0;
      local_798 = 1;
      v._M_array._4_4_ = in_stack_fffffffffffff31c;
      v._M_array._0_4_ = in_stack_fffffffffffff318;
      v._M_len = (size_type)in_stack_fffffffffffff320._M_current;
      pstd::
      span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_stack_fffffffffffff310,v);
      pbrt::ColorEncodingHandle::TaggedPointer
                ((ColorEncodingHandle *)in_stack_fffffffffffff310,in_stack_fffffffffffff308);
      pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffff310);
      channels.n._0_4_ = in_stack_fffffffffffff448;
      channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff440;
      channels.n._4_4_ = in_stack_fffffffffffff44c;
      alloc.memoryResource._4_4_ = in_stack_fffffffffffff43c;
      alloc.memoryResource._0_4_ = in_stack_fffffffffffff438;
      pbrt::Image::Image((Image *)CONCAT44(in_stack_fffffffffffff434,in_stack_fffffffffffff430),
                         format,(Point2i)in_stack_fffffffffffff450,channels,
                         in_stack_fffffffffffff420,alloc);
      local_b98 = (string *)&local_7a0;
      uVar9 = local_7d8;
      do {
        local_b98 = local_b98 + -0x20;
        std::__cxx11::string::~string(local_b98);
        auVar15._8_56_ = extraout_var;
        auVar15._0_8_ = extraout_XMM1_Qa;
      } while (local_b98 != local_7c0);
      local_7dc = 0;
      while( true ) {
        iVar3 = local_7dc;
        local_7e4 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_458);
        local_808 = local_5a8;
        auVar14 = auVar15._0_16_;
        if (local_7e4.y <= iVar3) break;
        local_7e8 = 0;
        while( true ) {
          iVar3 = local_7e8;
          local_7f0 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_458);
          if (local_7f0.x <= iVar3) break;
          local_7f4 = 0.0;
          local_7f8 = 0;
          while( true ) {
            auVar16 = auVar15._4_12_;
            iVar3 = local_7f8;
            iVar2 = pbrt::Image::NChannels((Image *)0x3d715e);
            if (iVar2 <= iVar3) break;
            pvVar12 = pbrt::
                      Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                      ::operator()((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                                    *)in_stack_fffffffffffff320._M_current,in_stack_fffffffffffff31c
                                   ,in_stack_fffffffffffff318);
            this = std::
                   vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>
                   ::operator[](pvVar12,(long)local_7f8);
            dVar13 = pbrt::VarianceEstimator<double>::Variance(this);
            auVar15 = ZEXT864((ulong)((double)local_7f4 + dVar13));
            local_7f4 = (float)((double)local_7f4 + dVar13);
            local_7f8 = local_7f8 + 1;
          }
          pbrt::Point2<int>::Point2
                    ((Point2<int> *)in_stack_fffffffffffff310,(int)((ulong)uVar9 >> 0x20),(int)uVar9
                    );
          iVar3 = pbrt::Image::NChannels((Image *)0x3d7333);
          auVar15 = ZEXT1664(CONCAT124(auVar16,(float)iVar3));
          pbrt::Image::SetChannel
                    (in_stack_fffffffffffff388,(Point2i)in_stack_fffffffffffff390,
                     in_stack_fffffffffffff348._60_4_,in_stack_fffffffffffff348._56_4_);
          local_7e8 = local_7e8 + 1;
        }
        local_7dc = local_7dc + 1;
      }
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_220);
      auVar14 = vcvtusi2sd_avx512f(auVar14,sVar7 - 1);
      local_808 = local_808 / auVar14._0_8_;
      uVar9 = std::__cxx11::string::c_str();
      printf("%s estimate = %.9g\n",local_808,uVar9);
      uVar4 = std::__cxx11::string::empty();
      local_c19 = 0;
      if ((uVar4 & 1) == 0) {
        local_908.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        local_908.set = false;
        local_908._5_3_ = 0;
        pstd::optional<float>::optional(&local_908);
        auVar15 = ZEXT1664((undefined1  [16])0x0);
        local_900 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>
                     )vmovdqu64_avx512f(auVar15);
        local_8c0 = 0;
        pstd::optional<pbrt::SquareMatrix<4>_>::optional
                  ((optional<pbrt::SquareMatrix<4>_> *)&local_900.__align);
        local_8bc = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>
                     )vmovdqu64_avx512f(auVar15);
        local_87c = 0;
        pstd::optional<pbrt::SquareMatrix<4>_>::optional
                  ((optional<pbrt::SquareMatrix<4>_> *)&local_8bc.__align);
        local_878 = (aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)>)0x0;
        local_868 = 0;
        pstd::optional<pbrt::Bounds2<int>_>::optional
                  ((optional<pbrt::Bounds2<int>_> *)&local_878.__align);
        local_85c = 0;
        local_864 = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0x0;
        pstd::optional<pbrt::Point2<int>_>::optional
                  ((optional<pbrt::Point2<int>_> *)&local_864.__align);
        local_858.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
        local_858.set = false;
        local_858._5_3_ = 0;
        pstd::optional<int>::optional(&local_858);
        local_850.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        local_850.set = false;
        local_850._5_3_ = 0;
        pstd::optional<float>::optional(&local_850);
        local_848 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                     )0x0;
        uStack_840 = 0;
        pstd::optional<const_pbrt::RGBColorSpace_*>::optional
                  ((optional<const_pbrt::RGBColorSpace_*> *)&local_848.__align);
        uStack_818 = 0;
        uStack_810 = 0;
        local_838 = 0;
        uStack_830 = 0;
        uStack_828 = 0;
        uStack_820 = 0;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)0x3d76b9);
        bVar1 = pbrt::Image::Write(in_stack_fffffffffffffb80,name,
                                   (ImageMetadata *)metadata._M_current);
        local_c19 = bVar1 ^ 0xff;
        pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)in_stack_fffffffffffff310);
      }
      local_4 = (uint)((local_c19 & 1) != 0);
      pbrt::Image::~Image(&in_stack_fffffffffffff310->image);
      pbrt::
      Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
      ::~Array2D((Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>
                  *)in_stack_fffffffffffff320._M_current);
    }
LAB_003d77d2:
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff320._M_current);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff320._M_current);
    std::
    vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
    ::~vector((vector<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>,_std::allocator<pbrt::Array2D<std::vector<pbrt::VarianceEstimator<double>,_std::allocator<pbrt::VarianceEstimator<double>_>_>_>_>_>
               *)in_stack_fffffffffffff320._M_current);
    pbrt::ImageAndMetadata::~ImageAndMetadata(in_stack_fffffffffffff310);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff320._M_current);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int error(int argc, char *argv[]) {
    std::string referenceFile, errorFile, metric = "MSE";
    std::string filenameBase;
    std::array<int, 4> cropWindow = {-1, 0, -1, 0};

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("error", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "reference", &referenceFile, onError) ||
            ParseArg(&argv, "errorfile", &errorFile, onError) ||
            ParseArg(&argv, "metric", &metric, onError) ||
            ParseArg(&argv, "crop", pstd::MakeSpan(cropWindow), onError)) {
            // success
        } else if (filenameBase.empty() && argv[0][0] != '-') {
            filenameBase = *argv;
            ++argv;
        } else
            usage("error", "%s: unknown argument", *argv);
    }

    if (filenameBase.empty())
        usage("error", "Must provide base filename.");
    if (metric != "MSE" && metric != "MRSE" && metric != "L1")
        usage("error", "%s: --metric must be \"L1\", \"MSE\" or \"MRSE\".",
              metric.c_str());

    std::vector<std::string> filenames = MatchingFilenames(filenameBase);
    if (filenames.empty()) {
        fprintf(stderr, "%s: no matching filenames!\n", filenameBase.c_str());
        return 1;
    }

    if (referenceFile.empty())
        usage("error", "must provide --reference file.");
    ImageAndMetadata ref = Image::Read(referenceFile);
    Image &referenceImage = ref.image;

    // If last 2 are negative, they're taken as deltas
    if (cropWindow[1] < 0)
        cropWindow[1] = cropWindow[0] - cropWindow[1];
    if (cropWindow[3] < 0)
        cropWindow[3] = cropWindow[2] - cropWindow[3];
    auto crop = [&cropWindow](Image &image) {
        if (cropWindow[0] >= 0 && cropWindow[2] >= 0)
            image = image.Crop(
                Bounds2i({cropWindow[0], cropWindow[2]}, {cropWindow[1], cropWindow[3]}));
    };

    crop(referenceImage);

    // Compute error and error image
    using MultiChannelVarianceEstimator = std::vector<VarianceEstimator<double>>;
    std::vector<Array2D<MultiChannelVarianceEstimator>> pixelVariances(MaxThreadIndex());
    for (auto &amcve : pixelVariances) {
        amcve = Array2D<MultiChannelVarianceEstimator>(referenceImage.Resolution().x,
                                                       referenceImage.Resolution().y);
        for (auto &mcve : amcve)
            mcve.resize(referenceImage.NChannels());
    }

    std::vector<double> sumErrors(MaxThreadIndex(), 0.);
    std::vector<int> spp(filenames.size());
    std::atomic<bool> failed{false};
    ParallelFor(0, filenames.size(), [&](size_t i) {
        ImageAndMetadata imRead = Image::Read(filenames[i]);
        Image &im = imRead.image;
        crop(im);

        CHECK(imRead.metadata.samplesPerPixel.has_value());
        spp[i] = *imRead.metadata.samplesPerPixel;

        Image diffImage;
        ImageChannelValues error(referenceImage.NChannels());
        if (metric == "L1")
            error = im.L1Error(im.AllChannelsDesc(), referenceImage, &diffImage);
        else if (metric == "MSE")
            error = im.MSE(im.AllChannelsDesc(), referenceImage, &diffImage);
        else
            error = im.MRSE(im.AllChannelsDesc(), referenceImage, &diffImage);
        sumErrors[ThreadIndex] += error.Average();

        for (int y = 0; y < im.Resolution().y; ++y)
            for (int x = 0; x < im.Resolution().x; ++x) {
                MultiChannelVarianceEstimator &pixelVariance =
                    pixelVariances[ThreadIndex](x, y);
                for (int c = 0; c < im.NChannels(); ++c)
                    if (metric == "MRSE")
                        pixelVariance[c].Add(
                            im.GetChannel({x, y}, c) /
                            (0.01f + referenceImage.GetChannel({x, y}, c)));
                    else
                        pixelVariance[c].Add(im.GetChannel({x, y}, c));
            }
    });

    for (int i = 1; i < filenames.size(); ++i) {
        if (spp[i] != spp[0]) {
            printf("%s: spp %d mismatch. %s has %d.\n", filenames[i].c_str(), spp[i],
                   filenames[0].c_str(), spp[0]);
            return 1;
        }
    }

    if (failed)
        return 1;

    double sumError = std::accumulate(sumErrors.begin(), sumErrors.end(), 0.);

    Array2D<MultiChannelVarianceEstimator> pixelVariance(referenceImage.Resolution().x,
                                                         referenceImage.Resolution().y);
    for (auto &mcve : pixelVariance)
        mcve.resize(referenceImage.NChannels());

    for (const auto &pixVar : pixelVariances)
        for (int y = 0; y < referenceImage.Resolution().y; ++y)
            for (int x = 0; x < referenceImage.Resolution().x; ++x)
                for (int c = 0; c < referenceImage.NChannels(); ++c)
                    pixelVariance(x, y)[c].Merge(pixVar(x, y)[c]);

    Image errorImage(PixelFormat::Float,
                     {referenceImage.Resolution().x, referenceImage.Resolution().y},
                     {metric});
    for (int y = 0; y < referenceImage.Resolution().y; ++y)
        for (int x = 0; x < referenceImage.Resolution().x; ++x) {
            Float varSum = 0;
            for (int c = 0; c < referenceImage.NChannels(); ++c)
                varSum += pixelVariance(x, y)[c].Variance();
            errorImage.SetChannel({x, y}, 0, varSum / referenceImage.NChannels());
        }

    // MSE is the average over all of the pixels
    double error = sumError / (filenames.size() - 1);
    printf("%s estimate = %.9g\n", metric.c_str(), error);

    if (!errorFile.empty() && !errorImage.Write(errorFile)) {
        return 1;
    }

    return 0;
}